

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::AddLogSink(LogSink *destination)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  MutexLock local_18;
  MutexLock l;
  LogSink *destination_local;
  
  l.mu_ = (Mutex *)destination;
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_18,(Mutex *)sink_mutex_);
  if (sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    this = (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)operator_new(0x18);
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::vector(this);
    sinks_ = this;
  }
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (sinks_,(value_type *)&l);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

inline void LogDestination::AddLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  if (!sinks_)  sinks_ = new vector<LogSink*>;
  sinks_->push_back(destination);
}